

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCallSimplifierVisitor.cpp
# Opt level: O0

void __thiscall
IRT::CCallSimplifierVisitor::Visit(CCallSimplifierVisitor *this,CEseqExpression *expression)

{
  CStatement *pCVar1;
  CExpression *pCVar2;
  CEseqExpression *this_00;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_30;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_28;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_20;
  CEseqExpression *local_18;
  CEseqExpression *expression_local;
  CCallSimplifierVisitor *this_local;
  
  local_18 = expression;
  expression_local = (CEseqExpression *)this;
  pCVar1 = CEseqExpression::getStatement(expression);
  (**(pCVar1->super_IStatement).super_INode._vptr_INode)(pCVar1,this);
  pCVar2 = CEseqExpression::getExpression(local_18);
  (**(pCVar2->super_IExpression).super_INode._vptr_INode)(pCVar2,this);
  this_00 = (CEseqExpression *)operator_new(0x18);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_28,&this->childStatement);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_30,&this->childExpression);
  CEseqExpression::CEseqExpression(this_00,&local_28,&local_30);
  std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
  unique_ptr<std::default_delete<IRT::CExpression_const>,void>
            ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
             &local_20,(pointer)this_00);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::operator=
            (&this->childExpression,&local_20);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_20);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_30);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_28);
  return;
}

Assistant:

void IRT::CCallSimplifierVisitor::Visit(const CEseqExpression &expression) {
    expression.getStatement()->Accept(*this);
    expression.getExpression()->Accept(*this);

    childExpression = std::unique_ptr<const CExpression>(
            new CEseqExpression(std::move(childStatement), std::move(childExpression))
    );
}